

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O1

bool convertToIpv4(quint32 *a,Q_IPV6ADDR *a6,ConversionMode mode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (((QFlagsStorage<QHostAddress::ConversionModeFlag>)
       mode.super_QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>.
       super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i ==
       (QFlagsStorage<QHostAddress::ConversionModeFlag>)0x0) || (*(long *)a6->c != 0)) {
    return false;
  }
  uVar1 = *(uint *)(a6->c + 8);
  uVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar2 = 0;
  if (uVar3 != 0) {
    if (uVar3 != 0xffff) {
      return false;
    }
    if (((uint)mode.super_QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>.
               super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i & 1) != 0) {
      uVar1 = *(uint *)(a6->c + 0xc);
      uVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      goto LAB_001ad2ab;
    }
    if (uVar1 != 0) {
      return false;
    }
  }
  uVar1 = *(uint *)(a6->c + 0xc);
  if (((byte)mode.super_QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>.
             super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i >> 2 & uVar1 == 0) == 0) {
    uVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (uVar1 == 0x1000000) {
      uVar2 = 0x7f000001;
      uVar1 = (uint)mode.super_QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>.
                    super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i & 8;
    }
    else {
      uVar1 = (uint)mode.super_QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>.
                    super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i & 2;
    }
    if (uVar1 == 0) {
      return false;
    }
  }
LAB_001ad2ab:
  *a = uVar2;
  return true;
}

Assistant:

static bool convertToIpv4(quint32& a, const Q_IPV6ADDR &a6, const QHostAddress::ConversionMode mode)
{
    if (mode == QHostAddress::StrictConversion)
        return false;

    const uchar *ptr = a6.c;
    if (qFromUnaligned<quint64>(ptr) != 0)
        return false;

    const quint32 mid = qFromBigEndian<quint32>(ptr + 8);
    if ((mid == 0xffff) && (mode & QHostAddress::ConvertV4MappedToIPv4)) {
        a = qFromBigEndian<quint32>(ptr + 12);
        return true;
    }
    if (mid != 0)
        return false;

    const quint32 low = qFromBigEndian<quint32>(ptr + 12);
    if ((low == 0) && (mode & QHostAddress::ConvertUnspecifiedAddress)) {
        a = 0;
        return true;
    }
    if ((low == 1) && (mode & QHostAddress::ConvertLocalHost)) {
        a = INADDR_LOOPBACK;
        return true;
    }
    if ((low != 1) && (mode & QHostAddress::ConvertV4CompatToIPv4)) {
        a = low;
        return true;
    }
    return false;
}